

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.h
# Opt level: O0

SampledWavelengths * pbrt::SampledWavelengths::SampleXYZ(Float u)

{
  float *pfVar1;
  SampledWavelengths *in_RDI;
  Float FVar2;
  Float up;
  int i;
  SampledWavelengths *this;
  int local_8;
  
  this = in_RDI;
  SampledWavelengths(in_RDI);
  for (local_8 = 0; local_8 < 4; local_8 = local_8 + 1) {
    FVar2 = SampleXYZMatching(0.0);
    pfVar1 = pstd::array<float,_4>::operator[](&this->lambda,(long)local_8);
    *pfVar1 = FVar2;
    pstd::array<float,_4>::operator[](&this->lambda,(long)local_8);
    FVar2 = XYZMatchingPDF(9.718326e-39);
    pfVar1 = pstd::array<float,_4>::operator[](&this->pdf,(long)local_8);
    *pfVar1 = FVar2;
  }
  return in_RDI;
}

Assistant:

SampleXYZ(Float u) {
        SampledWavelengths swl;
        for (int i = 0; i < NSpectrumSamples; ++i) {
            // Compute _up_ for $i$th wavelength sample
            Float up = u + Float(i) / NSpectrumSamples;
            if (up > 1)
                up -= 1;

            swl.lambda[i] = SampleXYZMatching(up);
            swl.pdf[i] = XYZMatchingPDF(swl.lambda[i]);
        }
        return swl;
    }